

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

void flatbuffers::php::PhpGenerator::GetStartOfTable(StructDef *struct_def,string *code_ptr)

{
  bool bVar1;
  size_type_conflict sVar2;
  reference ppFVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  FieldDef *local_480;
  FieldDef *field_2;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_470;
  const_iterator it_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  string local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  FieldDef *local_368;
  FieldDef *field_1;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_358;
  const_iterator it_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_2b0;
  FieldDef *local_2a8;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_298;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *code;
  string *code_ptr_local;
  StructDef *struct_def_local;
  
  local_20 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)struct_def;
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator+(&local_70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return void\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::operator+(&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public static function start");
  std::operator+(&local_d0,&local_f0,code_ptr_local);
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::operator+=((string *)local_20,"(FlatBufferBuilder $builder)\n");
  std::operator+(&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::operator+(&local_150,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_130,&local_150,"$builder->StartObject(");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_150);
  sVar2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                    ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                     ((long)&code_ptr_local[7].field_2 + 8));
  NumToString<unsigned_long>(&local_170,sVar2);
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::operator+=((string *)local_20,");\n");
  std::operator+(&local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::operator+(&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"/**\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::operator+(&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @param FlatBufferBuilder $builder\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::operator+(&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," * @return ");
  std::operator+(&local_210,&local_230,code_ptr_local);
  std::operator+(&local_1f0,&local_210,"\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::operator+(&local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_," */\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"public static function create");
  std::operator+(&local_270,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it
                 ,code_ptr_local);
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::string::operator+=((string *)local_20,"(FlatBufferBuilder $builder, ");
  local_298._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_298,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_298);
    local_2a8 = *ppFVar3;
    if ((local_2a8->deprecated & 1U) == 0) {
      local_2b0._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      ((long)&code_ptr_local[7].field_2 + 8));
      bVar1 = __gnu_cxx::operator!=(&local_298,&local_2b0);
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_20,", ");
      }
      std::operator+(&local_2d0,"$",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8)
      ;
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_298);
  }
  std::__cxx11::string::operator+=((string *)local_20,")\n");
  std::operator+(&local_2f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"{\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::operator+(&local_330,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_310,&local_330,"$builder->startObject(");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  sVar2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                    ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                     ((long)&code_ptr_local[7].field_2 + 8));
  NumToString<unsigned_long>((string *)&it_1,sVar2);
  std::__cxx11::string::operator+=((string *)local_20,(string *)&it_1);
  std::__cxx11::string::~string((string *)&it_1);
  std::__cxx11::string::operator+=((string *)local_20,");\n");
  local_358._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field_1 = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_358,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field_1);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_358);
    local_368 = *ppFVar3;
    if ((local_368->deprecated & 1U) == 0) {
      std::operator+(&local_3a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_);
      std::operator+(&local_388,&local_3a8,"self::add");
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_388);
      std::__cxx11::string::~string((string *)&local_388);
      std::__cxx11::string::~string((string *)&local_3a8);
      ConvertCase(&local_428,(string *)local_368,kUpperCamel,kSnake);
      std::operator+(&local_408,&local_428,"($builder, $");
      std::operator+(&local_3e8,&local_408,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368)
      ;
      std::operator+(&local_3c8,&local_3e8,");\n");
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_428);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_358);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_448,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&it_2,
                 "$o = $builder->endObject();\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&it_2);
  local_470._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                  ((long)&code_ptr_local[7].field_2 + 8));
  while( true ) {
    field_2 = (FieldDef *)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                          *)((long)&code_ptr_local[7].field_2 + 8));
    bVar1 = __gnu_cxx::operator!=
                      (&local_470,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field_2);
    if (!bVar1) break;
    ppFVar3 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_470);
    local_480 = *ppFVar3;
    if (((local_480->deprecated & 1U) == 0) && (bVar1 = FieldDef::IsRequired(local_480), bVar1)) {
      std::operator+(&local_4c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Indent_abi_cxx11_);
      std::operator+(&local_4a0,&local_4c0,"$builder->required($o, ");
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::~string((string *)&local_4c0);
      NumToString<unsigned_short>(&local_4e0,(local_480->value).offset);
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::operator+(&local_520,");  // ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480)
      ;
      std::operator+(&local_500,&local_520,"\n");
      std::__cxx11::string::operator+=((string *)local_20,(string *)&local_500);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_470);
  }
  std::operator+(&local_560,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_);
  std::operator+(&local_540,&local_560,"return $o;\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::operator+(&local_580,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Indent_abi_cxx11_,"}\n\n");
  std::__cxx11::string::operator+=((string *)local_20,(string *)&local_580);
  std::__cxx11::string::~string((string *)&local_580);
  return;
}

Assistant:

static void GetStartOfTable(const StructDef &struct_def,
                              std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @return void\n";
    code += Indent + " */\n";
    code += Indent + "public static function start" + struct_def.name;
    code += "(FlatBufferBuilder $builder)\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->StartObject(";
    code += NumToString(struct_def.fields.vec.size());
    code += ");\n";
    code += Indent + "}\n\n";

    code += Indent + "/**\n";
    code += Indent + " * @param FlatBufferBuilder $builder\n";
    code += Indent + " * @return " + struct_def.name + "\n";
    code += Indent + " */\n";
    code += Indent + "public static function create" + struct_def.name;
    code += "(FlatBufferBuilder $builder, ";

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;

      if (field.deprecated) continue;
      if (it != struct_def.fields.vec.begin()) { code += ", "; }
      code += "$" + field.name;
    }
    code += ")\n";
    code += Indent + "{\n";
    code += Indent + Indent + "$builder->startObject(";
    code += NumToString(struct_def.fields.vec.size());
    code += ");\n";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      code += Indent + Indent + "self::add";
      code += ConvertCase(field.name, Case::kUpperCamel) + "($builder, $" +
              field.name + ");\n";
    }

    code += Indent + Indent + "$o = $builder->endObject();\n";

    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (!field.deprecated && field.IsRequired()) {
        code += Indent + Indent + "$builder->required($o, ";
        code += NumToString(field.value.offset);
        code += ");  // " + field.name + "\n";
      }
    }
    code += Indent + Indent + "return $o;\n";
    code += Indent + "}\n\n";
  }